

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

uint32_t rgbcx::bc4_block::get_block_values8(uint8_t *pDst,uint32_t l,uint32_t h)

{
  uint32_t h_local;
  uint32_t l_local;
  uint8_t *pDst_local;
  
  *pDst = (uint8_t)l;
  pDst[1] = (uint8_t)h;
  pDst[2] = (uint8_t)((ulong)(l * 6 + h) / 7);
  pDst[3] = (uint8_t)((ulong)(l * 5 + h * 2) / 7);
  pDst[4] = (uint8_t)((ulong)(l * 4 + h * 3) / 7);
  pDst[5] = (uint8_t)((ulong)(l * 3 + h * 4) / 7);
  pDst[6] = (uint8_t)((ulong)(l * 2 + h * 5) / 7);
  pDst[7] = (uint8_t)((ulong)(l + h * 6) / 7);
  return 8;
}

Assistant:

static inline uint32_t get_block_values8(uint8_t* pDst, uint32_t l, uint32_t h)
		{
			pDst[0] = static_cast<uint8_t>(l);
			pDst[1] = static_cast<uint8_t>(h);
			pDst[2] = static_cast<uint8_t>((l * 6 + h) / 7);
			pDst[3] = static_cast<uint8_t>((l * 5 + h * 2) / 7);
			pDst[4] = static_cast<uint8_t>((l * 4 + h * 3) / 7);
			pDst[5] = static_cast<uint8_t>((l * 3 + h * 4) / 7);
			pDst[6] = static_cast<uint8_t>((l * 2 + h * 5) / 7);
			pDst[7] = static_cast<uint8_t>((l + h * 6) / 7);
			return 8;
		}